

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathLocationSetFilter
               (xmlXPathParserContextPtr ctxt,xmlLocationSetPtr locset,int filterOpIndex,int minPos,
               int maxPos)

{
  int iVar1;
  int iVar2;
  xmlXPathContextPtr pxVar3;
  xmlDocPtr pxVar4;
  xmlNodePtr pxVar5;
  xmlXPathStepOp *pxVar6;
  xmlNodePtr pxVar7;
  bool bVar8;
  int iVar9;
  xmlXPathObjectPtr *ppxVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint local_6c;
  int local_68;
  
  if ((locset != (xmlLocationSetPtr)0x0) && (locset->locNr != 0)) {
    pxVar3 = ctxt->context;
    pxVar4 = pxVar3->doc;
    pxVar5 = pxVar3->node;
    iVar1 = pxVar3->contextSize;
    iVar2 = pxVar3->proximityPosition;
    pxVar6 = ctxt->comp->steps;
    pxVar3->contextSize = locset->locNr;
    if (locset->locNr < 1) {
      local_6c = 0;
      uVar11 = 0;
    }
    else {
      local_68 = 1;
      uVar11 = 0;
      local_6c = 0;
      do {
        pxVar7 = (xmlNodePtr)locset->locTab[(int)uVar11]->user;
        pxVar3->node = pxVar7;
        pxVar3->proximityPosition = uVar11 + 1;
        if ((pxVar7->type != XML_NAMESPACE_DECL) && (pxVar7->doc != (_xmlDoc *)0x0)) {
          pxVar3->doc = pxVar7->doc;
        }
        iVar9 = xmlXPathCompOpEvalToBoolean(ctxt,pxVar6 + filterOpIndex,1);
        if (ctxt->error == 0) {
          if (iVar9 < 0) {
            xmlXPathErr(ctxt,7);
            goto LAB_001ed37f;
          }
          if (((iVar9 == 0) || (local_68 < 1)) || (minPos < local_68)) {
            xmlXPathFreeObject(locset->locTab[(int)uVar11]);
            locset->locTab[(int)uVar11] = (xmlXPathObjectPtr)0x0;
          }
          else {
            if (uVar11 != local_6c) {
              locset->locTab[(int)local_6c] = locset->locTab[(int)uVar11];
              locset->locTab[(int)uVar11] = (xmlXPathObjectPtr)0x0;
            }
            local_6c = local_6c + 1;
          }
          bVar8 = true;
          if (iVar9 != 0) {
            if (local_68 == minPos) {
              bVar8 = false;
              uVar11 = uVar11 + 1;
            }
            else {
              local_68 = local_68 + 1;
            }
          }
        }
        else {
LAB_001ed37f:
          bVar8 = false;
        }
      } while ((bVar8) && (uVar11 = uVar11 + 1, (int)uVar11 < locset->locNr));
    }
    if ((int)uVar11 < locset->locNr) {
      lVar12 = (long)(int)uVar11;
      do {
        xmlXPathFreeObject(locset->locTab[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 < locset->locNr);
    }
    locset->locNr = local_6c;
    if ((int)local_6c < (int)((uint)locset->locMax >> 1) && 10 < locset->locMax) {
      uVar13 = 10;
      if (10 < (int)local_6c) {
        uVar13 = (ulong)local_6c;
      }
      ppxVar10 = (xmlXPathObjectPtr *)(*xmlRealloc)(locset->locTab,uVar13 * 8);
      if (ppxVar10 == (xmlXPathObjectPtr *)0x0) {
        ctxt->error = 0xf;
        xmlXPathErrMemory(ctxt->context,"shrinking locset\n");
      }
      else {
        locset->locTab = ppxVar10;
        locset->locMax = (int)uVar13;
      }
    }
    pxVar3->node = pxVar5;
    pxVar3->doc = pxVar4;
    pxVar3->contextSize = iVar1;
    pxVar3->proximityPosition = iVar2;
  }
  return;
}

Assistant:

static void
xmlXPathLocationSetFilter(xmlXPathParserContextPtr ctxt,
		          xmlLocationSetPtr locset,
		          int filterOpIndex,
                          int minPos, int maxPos)
{
    xmlXPathContextPtr xpctxt;
    xmlNodePtr oldnode;
    xmlDocPtr olddoc;
    xmlXPathStepOpPtr filterOp;
    int oldcs, oldpp;
    int i, j, pos;

    if ((locset == NULL) || (locset->locNr == 0) || (filterOpIndex == -1))
        return;

    xpctxt = ctxt->context;
    oldnode = xpctxt->node;
    olddoc = xpctxt->doc;
    oldcs = xpctxt->contextSize;
    oldpp = xpctxt->proximityPosition;
    filterOp = &ctxt->comp->steps[filterOpIndex];

    xpctxt->contextSize = locset->locNr;

    for (i = 0, j = 0, pos = 1; i < locset->locNr; i++) {
        xmlNodePtr contextNode = locset->locTab[i]->user;
        int res;

        xpctxt->node = contextNode;
        xpctxt->proximityPosition = i + 1;

        /*
        * Also set the xpath document in case things like
        * key() are evaluated in the predicate.
        *
        * TODO: Get real doc for namespace nodes.
        */
        if ((contextNode->type != XML_NAMESPACE_DECL) &&
            (contextNode->doc != NULL))
            xpctxt->doc = contextNode->doc;

        res = xmlXPathCompOpEvalToBoolean(ctxt, filterOp, 1);

        if (ctxt->error != XPATH_EXPRESSION_OK)
            break;
        if (res < 0) {
            /* Shouldn't happen */
            xmlXPathErr(ctxt, XPATH_EXPR_ERROR);
            break;
        }

        if ((res != 0) && ((pos >= minPos) && (pos <= maxPos))) {
            if (i != j) {
                locset->locTab[j] = locset->locTab[i];
                locset->locTab[i] = NULL;
            }

            j += 1;
        } else {
            /* Remove the entry from the initial location set. */
            xmlXPathFreeObject(locset->locTab[i]);
            locset->locTab[i] = NULL;
        }

        if (res != 0) {
            if (pos == maxPos) {
                i += 1;
                break;
            }

            pos += 1;
        }
    }

    /* Free remaining nodes. */
    for (; i < locset->locNr; i++)
        xmlXPathFreeObject(locset->locTab[i]);

    locset->locNr = j;

    /* If too many elements were removed, shrink table to preserve memory. */
    if ((locset->locMax > XML_NODESET_DEFAULT) &&
        (locset->locNr < locset->locMax / 2)) {
        xmlXPathObjectPtr *tmp;
        int locMax = locset->locNr;

        if (locMax < XML_NODESET_DEFAULT)
            locMax = XML_NODESET_DEFAULT;
        tmp = (xmlXPathObjectPtr *) xmlRealloc(locset->locTab,
                locMax * sizeof(xmlXPathObjectPtr));
        if (tmp == NULL) {
            xmlXPathPErrMemory(ctxt, "shrinking locset\n");
        } else {
            locset->locTab = tmp;
            locset->locMax = locMax;
        }
    }

    xpctxt->node = oldnode;
    xpctxt->doc = olddoc;
    xpctxt->contextSize = oldcs;
    xpctxt->proximityPosition = oldpp;
}